

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O1

void dump_token(Token *t)

{
  if (t->type == TOK_NUMBER) {
    printf("type = %d,\tn = %ld,  \tfilename = \"%s\",\tlineno = %lu\n",0x1d,(t->u).string,
           t->filename,t->lineno);
    return;
  }
  printf("type = %d,\tstring = \"%s\",  \tfilename = \"%s\",\tlineno = %lu\n",(ulong)t->type,
         (t->u).string,t->filename,t->lineno);
  return;
}

Assistant:

void
dump_token (const Token *t)
{
  if (t->type == TOK_NUMBER)
    printf ("type = %d,\tn = %ld,  \tfilename = \"%s\",\tlineno = %lu\n",
	    t->type, t->u.n, t->filename, t->lineno);
  else
    printf ("type = %d,\tstring = \"%s\",  \tfilename = \"%s\",\t"
	    "lineno = %lu\n", t->type, t->u.string, t->filename, t->lineno);
}